

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O1

char * TEST_bump_stacktrace_implementation(char *suggestion)

{
  GetStackImplementation *pGVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if (get_stack_impl_inited == '\0') {
    TEST_bump_stacktrace_implementation_cold_1();
  }
  if ((ulong)(uint)TEST_bump_stacktrace_implementation::selection != 4) {
    lVar3 = (ulong)(uint)TEST_bump_stacktrace_implementation::selection << 3;
    iVar4 = TEST_bump_stacktrace_implementation::selection;
    do {
      iVar4 = iVar4 + 1;
      pGVar1 = *(GetStackImplementation **)((long)all_impls + lVar3);
      if (suggestion == (char *)0x0) {
        if (lVar3 != 0x18) goto LAB_001023f8;
      }
      else {
        iVar2 = strcmp(suggestion,pGVar1->name);
        if ((lVar3 != 0x18) && (iVar2 == 0)) {
LAB_001023f8:
          get_stack_impl = pGVar1;
          TEST_bump_stacktrace_implementation::selection = iVar4;
          return pGVar1->name;
        }
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    TEST_bump_stacktrace_implementation::selection = 4;
    get_stack_impl = pGVar1;
  }
  return (char *)0x0;
}

Assistant:

const char* TEST_bump_stacktrace_implementation(const char* suggestion) {
  static int selection;
  constexpr int n = sizeof(all_impls)/sizeof(all_impls[0]);

  if (!get_stack_impl_inited) {
    fprintf(stderr, "Supported stacktrace methods:\n");
    for (int i = 0; i < n; i++) {
      fprintf(stderr, "* %s\n", all_impls[i]->name);
    }
    fprintf(stderr, "\n\n");
    get_stack_impl_inited = true;
  }

  do {
    if (selection == n) {
      return nullptr;
    }
    get_stack_impl = all_impls[selection++];

    if (suggestion && strcmp(suggestion, get_stack_impl->name) != 0) {
      continue;
    }
    if (get_stack_impl == &impl__null) {
      // skip null implementation
      continue;
    }
#ifdef HAVE_GST_arm
    if (get_stack_impl == &impl__arm) {
      // "arm" backtracer is hopelessly broken. So don't test. We
      // still ship it, though, just in case.
      continue;
    }
#endif  // HAVE_GST_arm
#if defined(HAVE_GST_generic_fp) && (!__x86_64__ && !__i386__ && !__aarch64__ && !__riscv)
    // Those "major" architectures have functional frame pointer
    // backtracer and they're built with -fno-omit-frame-pointers
    // -mno-omit-leaf-frame-pointer. So we do expect those tests to
    // succeed. Everyone else (e.g. 32-bit legacy arm) is unlikely to
    // pass.
    if (get_stack_impl == &impl__generic_fp || get_stack_impl == &impl__generic_fp_unsafe) {
      continue;
    }
#endif  // generic_fp && !"good architecture"
    break;
  } while (true);

  return get_stack_impl->name;
}